

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<wchar_t>::build_departure_set_r
          (CompositeATN<wchar_t> *this,CATNDepartureSetFactory<wchar_t> *deptset_factory,
          ATNPath *path,int color,PriorityChain *priority,ATNStateStack *stack)

{
  bool bVar1;
  int iVar2;
  Identifier *id;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *this_00;
  CharClass<wchar_t> *cc;
  ATNPath local_b0;
  NFATransition<wchar_t> *local_90;
  NFATransition<wchar_t> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range3;
  undefined1 local_60 [8];
  ATNPath parent_path;
  CATNNode<wchar_t> *node;
  ATNStateStack *stack_local;
  PriorityChain *priority_local;
  int color_local;
  ATNPath *path_local;
  CATNDepartureSetFactory<wchar_t> *deptset_factory_local;
  CompositeATN<wchar_t> *this_local;
  
  parent_path.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)get_node(this,path);
  bVar1 = CATNNode<wchar_t>::is_stop_node
                    ((CATNNode<wchar_t> *)
                     parent_path.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     .
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    ATNPath::parent_path((ATNPath *)local_60,path);
    iVar2 = ATNPath::depth((ATNPath *)local_60);
    if (iVar2 == 0) {
      id = ATNPath::leaf_id(path);
      build_wildcard_departure_set(this,deptset_factory,id,color,priority,stack);
    }
    else {
      build_departure_set_r(this,deptset_factory,(ATNPath *)local_60,color,priority,stack);
    }
    ATNPath::~ATNPath((ATNPath *)local_60);
  }
  else {
    this_00 = CATNNode<wchar_t>::get_transitions
                        ((CATNNode<wchar_t> *)
                         parent_path.
                         super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         .
                         super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end0 = std::
             vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ::begin(this_00);
    tr = (NFATransition<wchar_t> *)
         std::
         vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                       *)&tr), bVar1) {
      local_90 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                 ::operator*(&__end0);
      bVar1 = NFATransition<wchar_t>::is_epsilon(local_90);
      if (!bVar1) {
        cc = NFATransition<wchar_t>::label(local_90);
        iVar2 = NFATransition<wchar_t>::dest(local_90);
        ATNPath::replace_index(&local_b0,path,iVar2);
        CATNDepartureSetFactory<wchar_t>::add(deptset_factory,cc,&local_b0,color,priority);
        ATNPath::~ATNPath(&local_b0);
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_departure_set_r(CATNDepartureSetFactory<TCHAR>& deptset_factory, const ATNPath& path, int color, const PriorityChain& priority, ATNStateStack& stack) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    if (node.is_stop_node())
    {
        ATNPath parent_path = path.parent_path();

        if (parent_path.depth() == 0)
        {
            build_wildcard_departure_set(deptset_factory, path.leaf_id(), color, priority, stack);
        }
        else
        {
            build_departure_set_r(deptset_factory, parent_path, color, priority, stack);
        }
    }
    else
    {
        for (const auto& tr : node.get_transitions())
        {
            if (!tr.is_epsilon())
            {
                deptset_factory.add(tr.label(), path.replace_index(tr.dest()), color, priority);
            }
        }
    }
}